

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.h
# Opt level: O2

void __thiscall flatbuffers::CodeGenerator::~CodeGenerator(CodeGenerator *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~CodeGenerator() = default;